

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteMessageDocComment(Printer *printer,Descriptor *message)

{
  Descriptor *this;
  string *input;
  string local_38;
  Descriptor *local_18;
  Descriptor *message_local;
  Printer *printer_local;
  
  local_18 = message;
  message_local = (Descriptor *)printer;
  io::Printer::Print<>(printer,"/**\n");
  WriteDocCommentBody<google::protobuf::Descriptor>((Printer *)message_local,local_18);
  this = message_local;
  input = Descriptor::full_name_abi_cxx11_(local_18);
  EscapeJavadoc(&local_38,input);
  io::Printer::Print<char[9],std::__cxx11::string>
            ((Printer *)this," * Protobuf type {@code $fullname$}\n */\n",(char (*) [9])"fullname",
             &local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void WriteMessageDocComment(io::Printer* printer, const Descriptor* message) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, message);
  printer->Print(
      " * Protobuf type {@code $fullname$}\n"
      " */\n",
      "fullname", EscapeJavadoc(message->full_name()));
}